

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

void __thiscall
Parser::printError<Identifier>(Parser *this,Token *token,char *text,Identifier *args)

{
  string local_48;
  Identifier *local_28;
  Identifier *args_local;
  char *text_local;
  Token *token_local;
  Parser *this_local;
  
  local_28 = args;
  args_local = (Identifier *)text;
  text_local = (char *)token;
  token_local = (Token *)this;
  tinyformat::format<Identifier>(&local_48,text,args);
  printError(this,token,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void printError(const Token& token, const char* text, const Args&... args)
	{
		printError(token, tfm::format(text,args...));
	}